

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O0

void moveToHook(qfixed x,qfixed y,void *data)

{
  qreal *in_RDI;
  long in_FS_OFFSET;
  ByteStream *in_XMM0_Qa;
  char *in_XMM1_Qa;
  Stroker *t;
  qreal *y_00;
  ByteStream *this;
  
  this = *(ByteStream **)(in_FS_OFFSET + 0x28);
  y_00 = in_RDI;
  if (((ulong)in_RDI[1] & 1) == 0) {
    QPdf::ByteStream::operator<<(in_XMM0_Qa,in_XMM1_Qa);
  }
  if (((ulong)in_RDI[0xc] & 1) == 0) {
    QTransform::map((QTransform *)in_XMM0_Qa,(qreal)in_XMM1_Qa,(qreal)y_00,in_RDI,(qreal *)0x5f20fa)
    ;
  }
  QPdf::ByteStream::operator<<(this,(qreal)in_XMM0_Qa);
  QPdf::ByteStream::operator<<(this,(qreal)in_XMM0_Qa);
  QPdf::ByteStream::operator<<(in_XMM0_Qa,in_XMM1_Qa);
  *(undefined1 *)(in_RDI + 1) = 0;
  if (*(ByteStream **)(in_FS_OFFSET + 0x28) == this) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void moveToHook(qfixed x, qfixed y, void *data)
{
    QPdf::Stroker *t = (QPdf::Stroker *)data;
    if (!t->first)
        *t->stream << "h\n";
    if (!t->cosmeticPen)
        t->matrix.map(x, y, &x, &y);
    *t->stream << x << y << "m\n";
    t->first = false;
}